

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range.hpp
# Opt level: O0

ostream * test_detail::
          print_range<std::vector<unsigned_int,std::allocator<unsigned_int>>,burst::identity_fn>
                    (ostream *stream,vector<unsigned_int,_std::allocator<unsigned_int>_> *range)

{
  anon_class_16_2_aa65ec36 __f;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this;
  bool bVar1;
  reference value;
  uint *puVar2;
  const_iterator cVar3;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __first;
  ostream *poVar4;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_38;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_30;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_28;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_20;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *range_local;
  ostream *stream_local;
  
  local_20 = range;
  range_local = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)stream;
  std::operator<<(stream,"[");
  local_28._M_current =
       (uint *)std::begin<std::vector<unsigned_int,std::allocator<unsigned_int>>>(local_20);
  local_30._M_current =
       (uint *)std::end<std::vector<unsigned_int,std::allocator<unsigned_int>>>(local_20);
  bVar1 = __gnu_cxx::operator!=(&local_28,&local_30);
  this = range_local;
  if (bVar1) {
    local_38._M_current =
         (uint *)std::begin<std::vector<unsigned_int,std::allocator<unsigned_int>>>(local_20);
    value = __gnu_cxx::
            __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
            ::operator*(&local_38);
    puVar2 = burst::identity_fn::operator()((identity_fn *)((long)&stream_local + 7),value);
    std::ostream::operator<<(this,*puVar2);
    cVar3 = std::begin<std::vector<unsigned_int,std::allocator<unsigned_int>>>(local_20);
    __first = std::
              next<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                        (cVar3._M_current,1);
    cVar3 = std::end<std::vector<unsigned_int,std::allocator<unsigned_int>>>(local_20);
    __f.proj = (identity_fn *)((long)&stream_local + 7);
    __f.stream = (ostream *)range_local;
    std::
    for_each<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,test_detail::print_range<std::vector<unsigned_int,std::allocator<unsigned_int>>,burst::identity_fn>(std::ostream&,std::vector<unsigned_int,std::allocator<unsigned_int>>const&,burst::identity_fn)::_lambda(auto:1_const&)_1_>
              (__first,(__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        )cVar3._M_current,__f);
  }
  poVar4 = std::operator<<((ostream *)range_local,"]");
  return poVar4;
}

Assistant:

std::ostream & print_range (std::ostream & stream, const Range & range, UnaryFunction proj)
    {
        stream << "[";

        using std::begin;
        using std::end;

        if (begin(range) != end(range))
        {
            stream << proj(*begin(range));
            std::for_each(std::next(begin(range)), end(range),
                [& stream, & proj] (const auto & value)
                {
                    stream << ", " << proj(value);
                });
        }

        return stream << "]";
    }